

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (FieldGenerator *this,Printer *printer)

{
  LogMessage *pLVar1;
  LogFinisher local_41;
  LogMessage local_40;
  
  internal::LogMessage::LogMessage
            (&local_40,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
             ,0x76);
  pLVar1 = internal::LogMessage::operator<<(&local_40,"GenerateMergeFromCodedStreamWithPacking() ");
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,"called on field generator that does not support packing.");
  internal::LogFinisher::operator=(&local_41,pLVar1);
  internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void FieldGenerator::
GenerateMergeFromCodedStreamWithPacking(io::Printer* printer) const {
  // Reaching here indicates a bug. Cases are:
  //   - This FieldGenerator should support packing, but this method should be
  //     overridden.
  //   - This FieldGenerator doesn't support packing, and this method should
  //     never have been called.
  GOOGLE_LOG(FATAL) << "GenerateMergeFromCodedStreamWithPacking() "
             << "called on field generator that does not support packing.";

}